

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::ZoneHashBase::reset(ZoneHashBase *this,ZoneHeap *heap)

{
  uint uVar1;
  Slot *p;
  ZoneHeap *this_00;
  ulong uVar2;
  size_t in_RDX;
  
  p = (Slot *)this->_data;
  if (p == (Slot *)this->_embedded) {
LAB_0015eee7:
    this->_heap = heap;
    this->_size = 0;
    this->_bucketsCount = 1;
    this->_bucketsGrow = 1;
    this->_data = this->_embedded;
    this->_embedded[0] = (ZoneHashNode *)0x0;
    return;
  }
  this_00 = this->_heap;
  if (this_00->_zone == (Zone *)0x0) {
    reset();
  }
  else if (p != (Slot *)0x0) {
    uVar1 = this->_bucketsCount;
    if (uVar1 != 0) {
      if (uVar1 < 0x41) {
        if (uVar1 < 0x11) {
          in_RDX = 0x1fffffffff;
          uVar2 = (ulong)uVar1 * 8 + 0x1fffffffff >> 5;
        }
        else {
          in_RDX = 0x3fffffff7f;
          uVar2 = ((ulong)uVar1 * 8 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar2 = 0;
      }
      if (uVar1 < 0x41) {
        p->next = this_00->_slots[uVar2 & 0xffffffff];
        this_00->_slots[uVar2 & 0xffffffff] = p;
      }
      else {
        ZoneHeap::_releaseDynamic(this_00,p,in_RDX);
      }
      goto LAB_0015eee7;
    }
    goto LAB_0015ef16;
  }
  reset();
LAB_0015ef16:
  reset();
}

Assistant:

void ZoneHashBase::reset(ZoneHeap* heap) noexcept {
  ZoneHashNode** oldData = _data;
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _heap = heap;
  _size = 0;
  _bucketsCount = 1;
  _bucketsGrow = 1;
  _data = _embedded;
  _embedded[0] = nullptr;
}